

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadFunctionSection(BinaryReader *this,Offset section_size)

{
  Index *count;
  Index IVar1;
  int iVar2;
  Result RVar3;
  ulong in_RAX;
  char *format;
  uint uVar4;
  bool bVar5;
  uint32_t value;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x18])();
  if (iVar2 == 0) {
    count = &this->num_function_signatures_;
    RVar3 = ReadCount(this,count,"function signature count");
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x19])
                      (this->delegate_,(ulong)this->num_function_signatures_);
    if (iVar2 == 0) {
      bVar5 = *count != 0;
      if (bVar5) {
        uVar4 = 0;
        do {
          IVar1 = this->num_func_imports_;
          RVar3 = ReadU32Leb128(this,(uint32_t *)((long)&uStack_38 + 4),"function signature index");
          if (RVar3.enum_ == Error) {
LAB_00157a9e:
            if (bVar5) {
              return (Result)Error;
            }
            break;
          }
          iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1a])
                            (this->delegate_,(ulong)(IVar1 + uVar4),uStack_38 >> 0x20);
          if (iVar2 != 0) {
            PrintError(this,"OnFunction callback failed");
            goto LAB_00157a9e;
          }
          uVar4 = uVar4 + 1;
          bVar5 = uVar4 < *count;
        } while (bVar5);
      }
      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1b])();
      if (iVar2 == 0) {
        return (Result)Ok;
      }
      format = "EndFunctionSection callback failed";
    }
    else {
      format = "OnFunctionCount callback failed";
    }
  }
  else {
    format = "BeginFunctionSection callback failed";
  }
  PrintError(this,format);
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadFunctionSection(Offset section_size) {
  CALLBACK(BeginFunctionSection, section_size);
  CHECK_RESULT(
      ReadCount(&num_function_signatures_, "function signature count"));
  CALLBACK(OnFunctionCount, num_function_signatures_);
  for (Index i = 0; i < num_function_signatures_; ++i) {
    Index func_index = num_func_imports_ + i;
    Index sig_index;
    CHECK_RESULT(ReadIndex(&sig_index, "function signature index"));
    CALLBACK(OnFunction, func_index, sig_index);
  }
  CALLBACK0(EndFunctionSection);
  return Result::Ok;
}